

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatRead.c
# Opt level: O2

int Msat_ReadInt(char **pIn)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  char cVar4;
  int iVar5;
  
  Msat_ReadWhitespace(pIn);
  pcVar3 = *pIn;
  cVar1 = *pcVar3;
  if ((cVar1 == '-') || (cVar1 == '+')) {
    pcVar3 = pcVar3 + 1;
    *pIn = pcVar3;
  }
  cVar4 = *pcVar3;
  if (0xf5 < (byte)(cVar4 - 0x3aU)) {
    iVar5 = 0;
    while( true ) {
      pcVar3 = pcVar3 + 1;
      if (9 < (byte)(cVar4 - 0x30U)) break;
      iVar5 = (uint)(byte)(cVar4 - 0x30U) + iVar5 * 10;
      *pIn = pcVar3;
      cVar4 = *pcVar3;
    }
    iVar2 = -iVar5;
    if (cVar1 != '-') {
      iVar2 = iVar5;
    }
    return iVar2;
  }
  fprintf(_stderr,"PARSE ERROR! Unexpected char: %c\n",(ulong)(uint)(int)cVar4);
  exit(1);
}

Assistant:

static int Msat_ReadInt( char ** pIn ) 
{
    int     val = 0;
    int     neg = 0;

    Msat_ReadWhitespace( pIn );
    if ( **pIn == '-' ) 
        neg = 1, 
        (*pIn)++;
    else if ( **pIn == '+' ) 
        (*pIn)++;
    if ( **pIn < '0' || **pIn > '9' ) 
        fprintf(stderr, "PARSE ERROR! Unexpected char: %c\n", **pIn), 
        exit(1);
    while ( **pIn >= '0' && **pIn <= '9' )
        val = val*10 + (**pIn - '0'),
        (*pIn)++;
    return neg ? -val : val; 
}